

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<double>::SolveSSOR
          (TPZMatrix<double> *this,int64_t *numiterations,TPZFMatrix<double> *F,
          TPZFMatrix<double> *result,TPZFMatrix<double> *residual,TPZFMatrix<double> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent)

{
  ulong uVar1;
  long lVar2;
  REAL res;
  int64_t one;
  long *local_68;
  REAL local_60;
  TPZMatrix<double> *local_58;
  TPZFMatrix<double> *local_50;
  TPZFMatrix<double> *local_48;
  TPZFMatrix<double> *local_40;
  TPZFMatrix<double> *local_38;
  
  res = *tol + *tol + 1.0;
  local_68 = numiterations;
  if (*numiterations < 1) {
    lVar2 = 0;
  }
  else {
    uVar1 = (ulong)(uint)FromCurrent;
    lVar2 = 0;
    local_60 = overrelax;
    local_58 = this;
    local_50 = F;
    local_48 = result;
    local_40 = residual;
    local_38 = scratch;
    do {
      if (ABS(res) <= ABS(*tol)) break;
      one = 1;
      res = *tol;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x37])
                (local_60,this,&one,F,result,residual,scratch,&res,uVar1,1);
      one = 1;
      res = *tol;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x37])
                (local_60,this,&one,F,result,residual,scratch,&res,1,0xffffffffffffffff);
      lVar2 = lVar2 + 1;
      uVar1 = 1;
    } while (lVar2 < *local_68);
  }
  *local_68 = lVar2;
  *tol = res;
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSSOR(int64_t &numiterations, const TPZFMatrix<TVar> &F,
						  TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, const REAL overrelax,
						  REAL &tol,const int FromCurrent) {
	REAL res = tol*2.+1.;
	int64_t i, one = 1;
	int fromcurrent = FromCurrent;
	for(i=0; i<numiterations && fabs(res) > fabs(tol); i++) {
		one = 1;
		res = tol;
		SolveSOR(one,F,result,residual,scratch,overrelax,res,fromcurrent,1);
		one = 1;
		res = tol;
		fromcurrent = 1;
		SolveSOR(one,F,result,residual,scratch,overrelax,res,fromcurrent,-1);
		//                cout << "SSOR iter = " << i <<  " res = " << res << endl;
	}
	numiterations = i;
	tol = res;
}